

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::UpdateBufferRegion
          (DeviceContextVkImpl *this,BufferVkImpl *pBuffVk,Uint64 DstOffset,Uint64 NumBytes,
          VkBuffer vkSrcBuffer,Uint64 SrcOffset,RESOURCE_STATE_TRANSITION_MODE TransitionMode)

{
  Uint32 *pUVar1;
  VkBuffer dstBuffer;
  string msg;
  VkBufferCopy CopyRegion;
  
  if ((pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
      .m_Desc.Size < NumBytes + DstOffset) {
    FormatString<char[81]>
              (&msg,(char (*) [81])
                    "Update region is out of buffer bounds which will result in an undefined behavior"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBufferRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x82a);
    std::__cxx11::string::~string((string *)&msg);
  }
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyBufferState
            (this,pBuffVk,TransitionMode,RESOURCE_STATE_COPY_DEST,VK_ACCESS_TRANSFER_WRITE_BIT,
             "Updating buffer (DeviceContextVkImpl::UpdateBufferRegion)");
  CopyRegion.srcOffset = SrcOffset;
  CopyRegion.dstOffset = DstOffset;
  CopyRegion.size = NumBytes;
  if ((pBuffVk->m_VulkanBuffer).m_VkObject == (VkBuffer_T *)0x0) {
    FormatString<char[49]>(&msg,(char (*) [49])"Copy destination buffer must not be suballocated");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"UpdateBufferRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x833);
    std::__cxx11::string::~string((string *)&msg);
  }
  dstBuffer = BufferVkImpl::GetVkBuffer(pBuffVk);
  VulkanUtilities::VulkanCommandBuffer::CopyBuffer
            (&this->m_CommandBuffer,vkSrcBuffer,dstBuffer,1,&CopyRegion);
  pUVar1 = &(this->m_State).NumCommands;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void DeviceContextVkImpl::UpdateBufferRegion(BufferVkImpl*                  pBuffVk,
                                             Uint64                         DstOffset,
                                             Uint64                         NumBytes,
                                             VkBuffer                       vkSrcBuffer,
                                             Uint64                         SrcOffset,
                                             RESOURCE_STATE_TRANSITION_MODE TransitionMode)
{
    DEV_CHECK_ERR(DstOffset + NumBytes <= pBuffVk->GetDesc().Size,
                  "Update region is out of buffer bounds which will result in an undefined behavior");

    EnsureVkCmdBuffer();
    TransitionOrVerifyBufferState(*pBuffVk, TransitionMode, RESOURCE_STATE_COPY_DEST, VK_ACCESS_TRANSFER_WRITE_BIT, "Updating buffer (DeviceContextVkImpl::UpdateBufferRegion)");

    VkBufferCopy CopyRegion;
    CopyRegion.srcOffset = SrcOffset;
    CopyRegion.dstOffset = DstOffset;
    CopyRegion.size      = NumBytes;
    VERIFY(pBuffVk->m_VulkanBuffer != VK_NULL_HANDLE, "Copy destination buffer must not be suballocated");
    m_CommandBuffer.CopyBuffer(vkSrcBuffer, pBuffVk->GetVkBuffer(), 1, &CopyRegion);
    ++m_State.NumCommands;
}